

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O3

int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar2 == 0) {
    uVar2 = pMask->pData[0];
    uVar4 = pC1->pData[0] & ~uVar2;
    uVar3 = ~uVar2 & pC2->pData[0];
    if (uVar4 < uVar3) {
      return -1;
    }
    if (uVar4 <= uVar3) {
      uVar3 = pC1->pData[0] & uVar2;
      uVar2 = pC2->pData[0] & uVar2;
      if (uVar3 < uVar2) {
        return -1;
      }
      if (uVar3 <= uVar2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcCompare.c"
                      ,0x120,
                      "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                     );
      }
      return 1;
    }
  }
  else {
    uVar3 = uVar2;
    if (uVar2 == 1) {
      uVar2 = *(uint *)&pMask->field_0x14;
      uVar4 = *(uint *)&pC1->field_0x14 & ~uVar2;
      uVar3 = ~uVar2 & *(uint *)&pC2->field_0x14;
      if (uVar4 < uVar3) {
        return -1;
      }
      if (uVar4 <= uVar3) {
        uVar3 = pMask->pData[0];
        uVar5 = pC1->pData[0] & ~uVar3;
        uVar4 = ~uVar3 & pC2->pData[0];
        if (uVar5 < uVar4) {
          return -1;
        }
        if (uVar5 <= uVar4) {
          uVar4 = *(uint *)&pC1->field_0x14 & uVar2;
          uVar2 = *(uint *)&pC2->field_0x14 & uVar2;
          if (uVar4 < uVar2) {
            return -1;
          }
          if (uVar4 <= uVar2) {
            uVar2 = pC1->pData[0] & uVar3;
            uVar3 = pC2->pData[0] & uVar3;
            if (uVar2 < uVar3) {
              return -1;
            }
            if (uVar2 <= uVar3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcCompare.c"
                            ,0x145,
                            "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                           );
            }
            return 1;
          }
        }
      }
    }
    else {
      do {
        uVar5 = pC1->pData[uVar3] & ~pMask->pData[uVar3];
        uVar4 = ~pMask->pData[uVar3] & pC2->pData[uVar3];
        if (uVar5 < uVar4) {
          return -1;
        }
        if (uVar5 >= uVar4 && uVar5 != uVar4) {
          return 1;
        }
        bVar1 = 0 < (int)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar1);
      while( true ) {
        uVar4 = pC1->pData[uVar2] & pMask->pData[uVar2];
        uVar3 = pMask->pData[uVar2] & pC2->pData[uVar2];
        if (uVar4 < uVar3) {
          return -1;
        }
        if (uVar3 < uVar4) break;
        bVar1 = (int)uVar2 < 1;
        uVar2 = uVar2 - 1;
        if (bVar1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcCompare.c"
                        ,0x16b,
                        "int Mvc_CubeCompareIntOutsideAndUnderMask(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *)"
                       );
        }
      }
    }
  }
  return 1;
}

Assistant:

int Mvc_CubeCompareIntOutsideAndUnderMask( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    unsigned uBits1, uBits2;

    if ( Mvc_Cube1Words(pC1) )
    {
        // compare the cubes outside the mask
        uBits1 = pC1->pData[0] & ~(pMask->pData[0]);
        uBits2 = pC2->pData[0] & ~(pMask->pData[0]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // compare the cubes under the mask
        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        // compare the cubes outside the mask
        uBits1 = pC1->pData[1] & ~(pMask->pData[1]);
        uBits2 = pC2->pData[1] & ~(pMask->pData[1]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        uBits1 = pC1->pData[0] & ~(pMask->pData[0]);
        uBits2 = pC2->pData[0] & ~(pMask->pData[0]);
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // compare the cubes under the mask
        uBits1 = pC1->pData[1] & pMask->pData[1];
        uBits2 = pC2->pData[1] & pMask->pData[1];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        uBits1 = pC1->pData[0] & pMask->pData[0];
        uBits2 = pC2->pData[0] & pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;

        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
    else                            
    {
        int i;

        // compare the cubes outside the mask
        for( i = Mvc_CubeReadLast(pC1); i >= 0; i-- )
        {
            uBits1 = pC1->pData[i] & ~(pMask->pData[i]);
            uBits2 = pC2->pData[i] & ~(pMask->pData[i]);
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
        // compare the cubes under the mask
        for( i = Mvc_CubeReadLast(pC1); i >= 0; i-- )
        {
            uBits1 = pC1->pData[i] & pMask->pData[i];
            uBits2 = pC2->pData[i] & pMask->pData[i];
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
/*
        {
            Mvc_Cover_t * pCover;
            pCover = Mvc_CoverAlloc( NULL, 96 );
            Mvc_CubePrint( pCover, pC1 );
            Mvc_CubePrint( pCover, pC2 );
            Mvc_CubePrint( pCover, pMask );
        }
*/
        // cubes are equal
        // should never happen
        assert( 0 );
        return 0;
    }
}